

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O3

int png_get_text(png_const_structrp png_ptr,png_inforp info_ptr,png_textp *text_ptr,int *num_text)

{
  int iVar1;
  
  if ((info_ptr == (png_inforp)0x0 || png_ptr == (png_const_structrp)0x0) ||
     (iVar1 = info_ptr->num_text, iVar1 < 1)) {
    iVar1 = 0;
  }
  else if (text_ptr != (png_textp *)0x0) {
    *text_ptr = info_ptr->text;
  }
  if (num_text != (int *)0x0) {
    *num_text = iVar1;
  }
  return iVar1;
}

Assistant:

int PNGAPI
png_get_text(png_const_structrp png_ptr, png_inforp info_ptr,
    png_textp *text_ptr, int *num_text)
{
   if (png_ptr != NULL && info_ptr != NULL && info_ptr->num_text > 0)
   {
      png_debug1(1, "in 0x%lx retrieval function",
         (unsigned long)png_ptr->chunk_name);

      if (text_ptr != NULL)
         *text_ptr = info_ptr->text;

      if (num_text != NULL)
         *num_text = info_ptr->num_text;

      return info_ptr->num_text;
   }

   if (num_text != NULL)
      *num_text = 0;

   return(0);
}